

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void xmlRMutexUnlock(xmlRMutexPtr tok)

{
  xmlRMutexPtr tok_local;
  
  if (tok != (xmlRMutexPtr)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)tok);
    tok->held = tok->held - 1;
    if (tok->held == 0) {
      if (tok->waiters != 0) {
        pthread_cond_signal((pthread_cond_t *)&tok->cv);
      }
      memset(&tok->tid,0,8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)tok);
  }
  return;
}

Assistant:

void
xmlRMutexUnlock(xmlRMutexPtr tok ATTRIBUTE_UNUSED)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_lock(&tok->lock);
    tok->held--;
    if (tok->held == 0) {
        if (tok->waiters)
            pthread_cond_signal(&tok->cv);
        memset(&tok->tid, 0, sizeof(tok->tid));
    }
    pthread_mutex_unlock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    LeaveCriticalSection(&tok->cs);
#endif
}